

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void dialer_start_pipe(nni_dialer *d,nni_pipe *p)

{
  nni_sock *s_00;
  _Bool _Var1;
  int iVar2;
  nng_log_level nVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  char local_148 [8];
  char addr_1 [144];
  char addr [144];
  nni_sock *s;
  nni_pipe *p_local;
  nni_dialer *d_local;
  
  s_00 = d->d_sock;
  nni_mtx_lock(&s_00->s_mx);
  d->d_pipe = p;
  d->d_currtime = d->d_inirtime;
  nni_mtx_unlock(&s_00->s_mx);
  nni_stat_inc(&s_00->st_pipes,1);
  nni_stat_inc(&d->st_pipes,1);
  nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_PRE);
  _Var1 = nni_pipe_is_closed(p);
  if (_Var1) {
    nni_stat_inc(&d->st_reject,1);
    nni_stat_inc(&s_00->st_rejects,1);
    nVar3 = nng_log_get_level();
    if (NNG_LOG_INFO < nVar3) {
      uVar4 = nni_pipe_sock_id(p);
      pcVar6 = nni_pipe_peer_addr(p,addr_1 + 0x88);
      nng_log_debug("NNG-PIPEREJECT","Pipe on socket<%u> from %s rejected by callback",(ulong)uVar4,
                    pcVar6);
    }
    nni_pipe_rele(p);
  }
  else {
    iVar2 = (*(p->p_proto_ops).pipe_start)(p->p_proto_data);
    if (iVar2 == 0) {
      nni_stat_set_id(&p->st_root,p->p_id);
      nni_stat_set_id(&p->st_id,p->p_id);
      nni_stat_register(&p->st_root);
      nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_POST);
      nVar3 = nng_log_get_level();
      if (NNG_LOG_INFO < nVar3) {
        uVar4 = nni_pipe_id(p);
        uVar5 = nni_sock_id(s_00);
        pcVar6 = nni_pipe_peer_addr(p,local_148);
        nng_log_debug("NNG-CONNECT","Connected pipe<%u> on socket<%u> to %s",(ulong)uVar4,
                      (ulong)uVar5,pcVar6);
      }
      nni_pipe_rele(p);
    }
    else {
      nni_stat_inc(&d->st_reject,1);
      nni_stat_inc(&s_00->st_rejects,1);
      nni_pipe_close(p);
      nni_pipe_rele(p);
    }
  }
  return;
}

Assistant:

static void
dialer_start_pipe(nni_dialer *d, nni_pipe *p)
{
	nni_sock *s = d->d_sock;

	nni_mtx_lock(&s->s_mx);
	d->d_pipe     = p;
	d->d_currtime = d->d_inirtime;
	nni_mtx_unlock(&s->s_mx);

#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&s->st_pipes, 1);
	nni_stat_inc(&d->st_pipes, 1);
#endif

	nni_pipe_run_cb(p, NNG_PIPE_EV_ADD_PRE);

	if (nni_pipe_is_closed(p)) {
#ifdef NNG_ENABLE_STATS
		nni_stat_inc(&d->st_reject, 1);
		nni_stat_inc(&s->st_rejects, 1);
#endif
		if (nng_log_get_level() >= NNG_LOG_DEBUG) {
			char addr[NNG_MAXADDRSTRLEN];
			nng_log_debug("NNG-PIPEREJECT",
			    "Pipe on socket<%u> from %s rejected by callback",
			    nni_pipe_sock_id(p), nni_pipe_peer_addr(p, addr));
		}
		nni_pipe_rele(p);
		return;
	}

	if (p->p_proto_ops.pipe_start(p->p_proto_data) != 0) {
#ifdef NNG_ENABLE_STATS
		nni_stat_inc(&d->st_reject, 1);
		nni_stat_inc(&s->st_rejects, 1);
#endif
		nni_pipe_close(p);
		nni_pipe_rele(p);
		return;
	}
#ifdef NNG_ENABLE_STATS
	nni_stat_set_id(&p->st_root, (int) p->p_id);
	nni_stat_set_id(&p->st_id, (int) p->p_id);
	nni_stat_register(&p->st_root);
#endif
	nni_pipe_run_cb(p, NNG_PIPE_EV_ADD_POST);
	if (nng_log_get_level() >= NNG_LOG_DEBUG) {
		char addr[NNG_MAXADDRSTRLEN];
		nng_log_debug("NNG-CONNECT",
		    "Connected pipe<%u> on socket<%u> to %s", nni_pipe_id(p),
		    nni_sock_id(s), nni_pipe_peer_addr(p, addr));
	}
	nni_pipe_rele(p);
}